

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

void Extra_Truth4VarN(unsigned_short **puCanons,char ***puPhases,char **ppCounters,int nPhasesMax)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  unsigned_short *__ptr;
  char *__ptr_00;
  char **__ptr_01;
  int Polarity;
  ulong uVar4;
  
  __ptr = (unsigned_short *)calloc(1,0x20000);
  __ptr_00 = (char *)calloc(1,0x10000);
  __ptr_01 = (char **)Extra_ArrayAlloc(0x10000,nPhasesMax,1);
  for (uVar4 = 0; uVar4 != 0x10000; uVar4 = uVar4 + 1) {
    if ((ulong)__ptr[uVar4] == 0) {
      for (Polarity = 0; Polarity != 0x10; Polarity = Polarity + 1) {
        uVar3 = Extra_TruthPolarize((uint)uVar4,Polarity,4);
        if (((ulong)__ptr[uVar3] == 0) && (uVar4 != 0 || Polarity == 0)) {
          __ptr[uVar3] = (unsigned_short)uVar4;
          *__ptr_01[uVar3] = (char)Polarity;
          __ptr_00[uVar3] = '\x01';
        }
        else {
          if (uVar4 != __ptr[uVar3]) {
            __assert_fail("uCanons[uPhase] == uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                          ,0x351,"void Extra_Truth4VarN(unsigned short **, char ***, char **, int)")
            ;
          }
          cVar1 = __ptr_00[uVar3];
          if (cVar1 < nPhasesMax) {
            pcVar2 = __ptr_01[uVar3];
            __ptr_00[uVar3] = cVar1 + '\x01';
            pcVar2[(int)cVar1] = (char)Polarity;
          }
        }
      }
    }
    else if (uVar4 <= __ptr[uVar4]) {
      __assert_fail("uTruth > uCanons[uTruth]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                    ,0x342,"void Extra_Truth4VarN(unsigned short **, char ***, char **, int)");
    }
  }
  if (puCanons == (unsigned_short **)0x0) {
    free(__ptr);
  }
  else {
    *puCanons = __ptr;
  }
  if (puPhases == (char ***)0x0) {
    free(__ptr_01);
  }
  else {
    *puPhases = __ptr_01;
  }
  if (ppCounters != (char **)0x0) {
    *ppCounters = __ptr_00;
    return;
  }
  free(__ptr_00);
  return;
}

Assistant:

void Extra_Truth4VarN( unsigned short ** puCanons, char *** puPhases, char ** ppCounters, int nPhasesMax )
{
    unsigned short * uCanons;
    unsigned uTruth, uPhase;
    char ** uPhases, * pCounters;
    int nFuncs, nClasses, i;

    nFuncs  = (1 << 16);
    uCanons = ABC_ALLOC( unsigned short, nFuncs );
    memset( uCanons, 0, sizeof(unsigned short) * nFuncs );
    pCounters = ABC_ALLOC( char, nFuncs );
    memset( pCounters, 0, sizeof(char) * nFuncs );
    uPhases = (char **)Extra_ArrayAlloc( nFuncs, nPhasesMax, sizeof(char) );
    nClasses = 0;
    for ( uTruth = 0; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        if ( uCanons[uTruth] )
        {
            assert( uTruth > uCanons[uTruth] );
            continue;
        }
        nClasses++;
        for ( i = 0; i < 16; i++ )
        {
            uPhase = Extra_TruthPolarize( uTruth, i, 4 );
            if ( uCanons[uPhase] == 0 && (uTruth || i==0) )
            {
                uCanons[uPhase]    = uTruth;
                uPhases[uPhase][0] = i;
                pCounters[uPhase]  = 1;
            }
            else
            {
                assert( uCanons[uPhase] == uTruth );
                if ( pCounters[uPhase] < nPhasesMax )
                    uPhases[uPhase][ (int)pCounters[uPhase]++ ] = i;
            }
        }
    }
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( ppCounters ) 
        *ppCounters = pCounters;
    else
        ABC_FREE( pCounters );
//    printf( "The number of 4N-classes = %d.\n", nClasses );
}